

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::start(thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
        *this)

{
  runtime_error *this_00;
  undefined1 auStack_48 [16];
  lock_guard locker;
  
  std::unique_lock<std::mutex>::unique_lock(&locker.m_lock,(mutex_type *)this);
  if ((this->
      super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
      ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this->m_shutdown = false;
    std::
    make_shared<std::thread,std::_Bind<void(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::*(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>*))()>>
              ((_Bind<void_(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>::*(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*))()>
                *)auStack_48);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->
                super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)auStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
    std::unique_lock<std::mutex>::~unique_lock(&locker.m_lock);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"timer thread is already started");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
	start()
	{
		typename base_type::lock_guard locker{ *this };

		if( this->m_thread )
			throw std::runtime_error( "timer thread is already started" );
		else
			this->m_shutdown = false;

		this->m_thread = std::make_shared< std::thread >(
				std::bind( &thread_impl_template::body, this ) );
	}